

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_401x2(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  gen_spr_401(env);
  if ((((env->spr_cb[0x3b1].name == (char *)0x0) && (env->spr[0x3b1] == 0)) &&
      (env->spr_cb[0x3b1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3b1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3b1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3b1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3b1].name = "PID";
    env->spr_cb[0x3b1].uea_read = spr_noaccess;
    env->spr_cb[0x3b1].uea_write = spr_noaccess;
    env->spr_cb[0x3b1].oea_read = spr_read_generic;
    env->spr_cb[0x3b1].oea_write = spr_write_generic;
    env->spr_cb[0x3b1].hea_read = spr_read_generic;
    env->spr_cb[0x3b1].hea_write = spr_write_generic;
    env->spr_cb[0x3b1].default_value = 0;
    env->spr[0x3b1] = 0;
    if (((env->spr_cb[0x3b0].name == (char *)0x0) && (env->spr[0x3b0] == 0)) &&
       ((env->spr_cb[0x3b0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3b0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3b0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3b0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3b0].name = "ZPR";
      env->spr_cb[0x3b0].uea_read = spr_noaccess;
      env->spr_cb[0x3b0].uea_write = spr_noaccess;
      env->spr_cb[0x3b0].oea_read = spr_read_generic;
      env->spr_cb[0x3b0].oea_write = spr_write_generic;
      env->spr_cb[0x3b0].hea_read = spr_read_generic;
      env->spr_cb[0x3b0].hea_write = spr_write_generic;
      env->spr_cb[0x3b0].default_value = 0;
      env->spr[0x3b0] = 0;
      return;
    }
    uVar2 = 0x3b0;
    uVar1 = 0x3b0;
  }
  else {
    uVar2 = 0x3b1;
    uVar1 = 0x3b1;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_401x2(CPUPPCState *env)
{
    gen_spr_401(env);
    spr_register(env, SPR_40x_PID, "PID",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_ZPR, "ZPR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}